

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ExtensionDeclarationRequireDeclarationsForAll_Test::TestBody
          (CommandLineInterfaceTest_ExtensionDeclarationRequireDeclarationsForAll_Test *this)

{
  string_view name;
  string_view expected_substring;
  string_view contents;
  string local_38;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n    syntax = \"proto2\";\n    package foo;\n    message Foo {\n      extensions 4000 to max [ declaration = {\n          number: 5000,\n          full_name: \".foo.o\"\n          type: \"int32\"\n        }];\n    }\n\n    extend Foo {\n      optional int32 o = 5000;\n      repeated int32 i = 9000;\n    }"
  ;
  contents._M_len = 0x11f;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto","");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  expected_substring._M_str =
       "Missing extension declaration for field foo.i with number 9000 in extendee message foo.Foo";
  expected_substring._M_len = 0x5a;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       ExtensionDeclarationRequireDeclarationsForAll) {
  CreateTempFile("foo.proto", R"schema(
    syntax = "proto2";
    package foo;
    message Foo {
      extensions 4000 to max [ declaration = {
          number: 5000,
          full_name: ".foo.o"
          type: "int32"
        }];
    }

    extend Foo {
      optional int32 o = 5000;
      repeated int32 i = 9000;
    })schema");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Missing extension declaration for field foo.i with number 9000 in "
      "extendee message foo.Foo");
}